

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageLevel.cpp
# Opt level: O0

void __thiscall
Imf_3_2::FlatImageLevel::insertChannel
          (FlatImageLevel *this,string *name,PixelType type,int xSampling,int ySampling,bool pLinear
          )

{
  bool bVar1;
  iterator __k;
  mapped_type pFVar2;
  mapped_type *ppFVar3;
  int in_EDX;
  FlatImageLevel *in_RDI;
  undefined4 in_R8D;
  undefined1 in_R9B;
  string *in_stack_00000148;
  ImageLevel *in_stack_00000150;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
  *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 pLinear_00;
  int in_stack_ffffffffffffffb0;
  TypedFlatImageChannel<Imath_3_2::half> *in_stack_ffffffffffffffc0;
  _Self local_30;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar4;
  
  pLinear_00 = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  uVar4 = CONCAT13(in_R9B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  __k = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
        ::find(in_stack_ffffffffffffff98,(key_type *)0x12ef5c);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,&local_30);
  if (bVar1) {
    ImageLevel::throwChannelExists(in_stack_00000150,in_stack_00000148);
  }
  if (in_EDX == 0) {
    pFVar2 = (mapped_type)operator_new(0x40);
    TypedFlatImageChannel<unsigned_int>::TypedFlatImageChannel
              ((TypedFlatImageChannel<unsigned_int> *)in_stack_ffffffffffffffc0,in_RDI,in_EDX,
               in_stack_ffffffffffffffb0,(bool)pLinear_00);
    ppFVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
                            *)CONCAT44(in_R8D,uVar4),(key_type *)__k._M_node);
    *ppFVar3 = pFVar2;
  }
  else if (in_EDX == 1) {
    pFVar2 = (mapped_type)operator_new(0x40);
    TypedFlatImageChannel<Imath_3_2::half>::TypedFlatImageChannel
              (in_stack_ffffffffffffffc0,in_RDI,in_EDX,in_stack_ffffffffffffffb0,
               SUB81((ulong)pFVar2 >> 0x38,0));
    ppFVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
                            *)CONCAT44(in_R8D,uVar4),(key_type *)__k._M_node);
    *ppFVar3 = pFVar2;
  }
  else if (in_EDX == 2) {
    pFVar2 = (mapped_type)operator_new(0x40);
    TypedFlatImageChannel<float>::TypedFlatImageChannel
              ((TypedFlatImageChannel<float> *)in_stack_ffffffffffffffc0,in_RDI,in_EDX,
               in_stack_ffffffffffffffb0,(bool)pLinear_00);
    ppFVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
                            *)CONCAT44(in_R8D,uVar4),(key_type *)__k._M_node);
    *ppFVar3 = pFVar2;
  }
  return;
}

Assistant:

void
FlatImageLevel::insertChannel (
    const string& name,
    PixelType     type,
    int           xSampling,
    int           ySampling,
    bool          pLinear)
{
    if (_channels.find (name) != _channels.end ()) throwChannelExists (name);

    switch (type)
    {
        case HALF:
            _channels[name] =
                new FlatHalfChannel (*this, xSampling, ySampling, pLinear);
            break;

        case FLOAT:
            _channels[name] =
                new FlatFloatChannel (*this, xSampling, ySampling, pLinear);
            break;

        case UINT:
            _channels[name] =
                new FlatUIntChannel (*this, xSampling, ySampling, pLinear);
            break;

        default: assert (false);
    }
}